

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adaptcontroller.c
# Opt level: O0

SUNErrCode SUNAdaptController_Destroy(SUNAdaptController C)

{
  long *in_RDI;
  SUNErrCode local_4;
  
  if (in_RDI == (long *)0x0) {
    local_4 = 0;
  }
  else if ((in_RDI[1] == 0) || (*(long *)(in_RDI[1] + 0x18) == 0)) {
    if (*in_RDI != 0) {
      free((void *)*in_RDI);
      *in_RDI = 0;
    }
    if (in_RDI[1] != 0) {
      free((void *)in_RDI[1]);
      in_RDI[1] = 0;
    }
    free(in_RDI);
    local_4 = 0;
  }
  else {
    local_4 = (**(code **)(in_RDI[1] + 0x18))(in_RDI);
  }
  return local_4;
}

Assistant:

SUNErrCode SUNAdaptController_Destroy(SUNAdaptController C)
{
  if (C == NULL) { return (SUN_SUCCESS); }

  /* if the destroy operation exists use it */
  if (C->ops)
  {
    if (C->ops->destroy) { return (C->ops->destroy(C)); }
  }

  /* if we reach this point, either ops == NULL or destroy == NULL,
     try to cleanup by freeing the content, ops, and matrix */
  if (C->content)
  {
    free(C->content);
    C->content = NULL;
  }
  if (C->ops)
  {
    free(C->ops);
    C->ops = NULL;
  }
  free(C);
  C = NULL;

  return (SUN_SUCCESS);
}